

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O0

int tcg_out_pool_finalize(TCGContext_conflict9 *s)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  size_t __n;
  size_t size;
  char *a;
  TCGLabelPoolData *l;
  TCGLabelPoolData *p;
  TCGContext_conflict9 *s_local;
  
  l = s->pool_labels;
  a = (char *)0x0;
  if (l != (TCGLabelPoolData *)0x0) {
    size = (ulong)(s->code_ptr + (ulong)l->nlong * 8 + -1) & (ulong)l->nlong * -8;
    tcg_out_nop_fill(s->code_ptr,(int)size - (int)s->code_ptr);
    s->data_gen_ptr = (void *)size;
    for (; l != (TCGLabelPoolData *)0x0; l = l->next) {
      uVar1 = l->nlong;
      __n = (ulong)uVar1 * 8;
      if (((a == (char *)0x0) || (*(uint *)(a + 0x1c) != l->nlong)) ||
         (iVar3 = memcmp(a + 0x20,l + 1,__n), iVar3 != 0)) {
        if (s->code_gen_highwater < size) {
          return -1;
        }
        memcpy((void *)size,l + 1,__n);
        size = __n + size;
        a = (char *)l;
      }
      _Var2 = patch_reloc(l->label,l->rtype,size + (ulong)uVar1 * -8,l->addend);
      if (!_Var2) {
        return -2;
      }
    }
    s->code_ptr = (tcg_insn_unit *)size;
  }
  return 0;
}

Assistant:

static int tcg_out_pool_finalize(TCGContext *s)
{
    TCGLabelPoolData *p = s->pool_labels;
    TCGLabelPoolData *l = NULL;
    char *a;

    if (p == NULL) {
        return 0;
    }

    /* ??? Round up to qemu_icache_linesize, but then do not round
       again when allocating the next TranslationBlock structure.  */
    a = (void *)ROUND_UP((uintptr_t)s->code_ptr,
                         sizeof(tcg_target_ulong) * p->nlong);
    tcg_out_nop_fill(s->code_ptr, (tcg_insn_unit *)a - s->code_ptr);
    s->data_gen_ptr = a;

    for (; p != NULL; p = p->next) {
        size_t size = sizeof(tcg_target_ulong) * p->nlong;
        if (!l || l->nlong != p->nlong || memcmp(l->data, p->data, size)) {
            if (unlikely(a > (char *)s->code_gen_highwater)) {
                return -1;
            }
            memcpy(a, p->data, size);
            a += size;
            l = p;
        }
        if (!patch_reloc(p->label, p->rtype, (intptr_t)a - size, p->addend)) {
            return -2;
        }
    }

    s->code_ptr = (tcg_insn_unit *)a;
    return 0;
}